

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall
helics::BrokerBase::setLogLevels(BrokerBase *this,int32_t consoleLevel,int32_t fileLevel)

{
  LogManager::setLogLevels
            ((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,consoleLevel,fileLevel);
  LOCK();
  (this->maxLogLevel).super___atomic_base<int>._M_i =
       (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->maxLogLevel).super___atomic_base<int>._M_i;
  UNLOCK();
  return;
}

Assistant:

void BrokerBase::setLogLevels(int32_t consoleLevel, int32_t fileLevel)
{
    mLogManager->setLogLevels(consoleLevel, fileLevel);
    maxLogLevel.store(mLogManager->getMaxLevel());
}